

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O3

int uv_socketpair(int type,int protocol,uv_os_sock_t *fds,int flags0,int flags1)

{
  int iVar1;
  int *piVar2;
  uint local_38;
  int local_34;
  int flags;
  int err;
  uv_os_sock_t temp [2];
  int flags1_local;
  int flags0_local;
  uv_os_sock_t *fds_local;
  int protocol_local;
  int type_local;
  
  local_38 = type | 0x80000;
  if (((flags0 & 0x40U) != 0) && ((flags1 & 0x40U) != 0)) {
    local_38 = type | 0x80800;
  }
  temp[0] = flags1;
  temp[1] = flags0;
  iVar1 = socketpair(1,local_38,protocol,&flags);
  if (iVar1 == 0) {
    if ((local_38 & 0x800) == 0) {
      if ((((temp[1] & 0x40U) == 0) || (local_34 = uv__nonblock_ioctl(flags,1), local_34 == 0)) &&
         (((temp[0] & 0x40U) == 0 || (local_34 = uv__nonblock_ioctl(err,1), local_34 == 0)))) {
        *fds = flags;
        fds[1] = err;
        protocol_local = 0;
      }
      else {
        uv__close(flags);
        uv__close(err);
        protocol_local = local_34;
      }
    }
    else {
      *fds = flags;
      fds[1] = err;
      protocol_local = 0;
    }
  }
  else {
    piVar2 = __errno_location();
    protocol_local = -*piVar2;
  }
  return protocol_local;
}

Assistant:

int uv_socketpair(int type, int protocol, uv_os_sock_t fds[2], int flags0, int flags1) {
  uv_os_sock_t temp[2];
  int err;
#if defined(__FreeBSD__) || defined(__linux__)
  int flags;

  flags = type | SOCK_CLOEXEC;
  if ((flags0 & UV_NONBLOCK_PIPE) && (flags1 & UV_NONBLOCK_PIPE))
    flags |= SOCK_NONBLOCK;

  if (socketpair(AF_UNIX, flags, protocol, temp))
    return UV__ERR(errno);

  if (flags & UV_FS_O_NONBLOCK) {
    fds[0] = temp[0];
    fds[1] = temp[1];
    return 0;
  }
#else
  if (socketpair(AF_UNIX, type, protocol, temp))
    return UV__ERR(errno);

  if ((err = uv__cloexec(temp[0], 1)))
    goto fail;
  if ((err = uv__cloexec(temp[1], 1)))
    goto fail;
#endif

  if (flags0 & UV_NONBLOCK_PIPE)
    if ((err = uv__nonblock(temp[0], 1)))
        goto fail;
  if (flags1 & UV_NONBLOCK_PIPE)
    if ((err = uv__nonblock(temp[1], 1)))
      goto fail;

  fds[0] = temp[0];
  fds[1] = temp[1];
  return 0;

fail:
  uv__close(temp[0]);
  uv__close(temp[1]);
  return err;
}